

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O1

void __thiscall helics::apps::Clone::saveFile(Clone *this,string *filename)

{
  value_t vVar1;
  char *pcVar2;
  pointer pbVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer puVar6;
  Time TVar7;
  Message *pMVar8;
  size_t __n;
  byte *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  bool bVar11;
  int iVar12;
  difference_type __node_offset_1;
  reference pvVar13;
  _Elt_pointer pIVar14;
  string *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  ostream *poVar16;
  difference_type __node_offset;
  long lVar17;
  json_value jVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong uVar20;
  undefined8 uVar21;
  Input *this_00;
  data *pdVar22;
  undefined1 auVar23 [8];
  pointer puVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sub;
  pointer val_00;
  string *val_01;
  string_view jsonString;
  data local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  data local_408;
  data local_3f8;
  data local_3e8;
  data local_3d0;
  data local_3c0;
  data local_3b0;
  data local_3a0;
  data local_390;
  data local_380;
  data local_370;
  data local_360;
  data local_350;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  data local_300;
  data local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  int local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  data local_2c0;
  data local_2b0;
  string *local_2a0;
  data local_298;
  data local_288;
  data local_278;
  data local_260;
  data local_250;
  data local_240;
  undefined1 local_230 [8];
  json_value local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  while (filename->_M_string_length == 0) {
    filename = &(this->super_App).outFileName;
    if ((this->super_App).outFileName._M_string_length == 0) {
      return;
    }
  }
  pcVar2 = (char *)(this->fedConfig)._M_string_length;
  if (pcVar2 == (char *)0x0) {
    local_438.m_type = null;
    local_438.m_value.object = (object_t *)0x0;
  }
  else {
    jsonString._M_str = pcVar2;
    jsonString._M_len = (size_t)&local_438;
    fileops::loadJsonStr_abi_cxx11_(jsonString);
  }
  local_278.m_type = null;
  local_278._1_7_ = 0;
  local_278.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_278,true);
  pvVar13 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)&local_438,"defaultglobal");
  vVar1 = (pvVar13->m_data).m_type;
  (pvVar13->m_data).m_type = local_278.m_type;
  local_278.m_type = vVar1;
  jVar18 = (pvVar13->m_data).m_value;
  (pvVar13->m_data).m_value.object = (object_t *)local_278.m_value;
  local_2a0 = filename;
  local_278.m_value = jVar18;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_278);
  if ((this->cloneSubscriptionNames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->cloneSubscriptionNames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_288.m_type = null;
    local_288._1_7_ = 0;
    local_288.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_288,true);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_438,"optional");
    vVar1 = (pvVar13->m_data).m_type;
    (pvVar13->m_data).m_type = local_288.m_type;
    local_288.m_type = vVar1;
    jVar18 = (pvVar13->m_data).m_value;
    (pvVar13->m_data).m_value.object = (object_t *)local_288.m_value;
    local_288.m_value = jVar18;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_288);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_240,(initializer_list_t)ZEXT816(0),false,array);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_438,"subscriptions");
    vVar1 = (pvVar13->m_data).m_type;
    (pvVar13->m_data).m_type = local_240.m_type;
    jVar18 = (pvVar13->m_data).m_value;
    (pvVar13->m_data).m_value = local_240.m_value;
    local_240.m_type = vVar1;
    local_240.m_value = jVar18;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_240);
    val_00 = (this->cloneSubscriptionNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->cloneSubscriptionNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (val_00 != pbVar3) {
      do {
        local_230 = (undefined1  [8])((ulong)local_230 & 0xffffffffffffff00);
        local_228.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_230,"key");
        vVar1 = (pvVar13->m_data).m_type;
        (pvVar13->m_data).m_type = local_2f0.m_type;
        jVar18 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value = local_2f0.m_value;
        local_2f0.m_type = vVar1;
        local_2f0.m_value = jVar18;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_2f0);
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_438,"subscriptions");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)local_230);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_230);
        val_00 = (pointer)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           val_00 + 1);
      } while (val_00 != pbVar3);
    }
  }
  if ((this->points).
      super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->points).
      super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_250,(initializer_list_t)ZEXT816(0),false,array);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_438,"points");
    vVar1 = (pvVar13->m_data).m_type;
    (pvVar13->m_data).m_type = local_250.m_type;
    jVar18 = (pvVar13->m_data).m_value;
    (pvVar13->m_data).m_value = local_250.m_value;
    local_250.m_type = vVar1;
    local_250.m_value = jVar18;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_250);
    pVVar4 = (this->points).
             super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar5 = (this->points).
             super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar4 != pVVar5) {
      do {
        val_01 = &pVVar4->value;
        local_230 = (undefined1  [8])((ulong)local_230 & 0xffffffffffffff00);
        local_228.object = (object_t *)0x0;
        pIVar14 = (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        lVar17 = ((long)pIVar14 -
                  (long)(this->subscriptions).
                        super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
                 (long)*(int *)((long)(val_01 + -1) + 0x18);
        if (lVar17 == 0) {
          pIVar14 = pIVar14 + *(int *)((long)(val_01 + -1) + 0x18);
        }
        else {
          pIVar14 = (this->subscriptions).
                    super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[lVar17];
        }
        if ((pIVar14->givenTarget)._M_string_length == 0) {
          pbVar15 = Interface::getSourceTargets_abi_cxx11_(&pIVar14->super_Interface);
        }
        else {
          pbVar15 = &pIVar14->givenTarget;
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_350,pbVar15);
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_230,"key");
        vVar1 = (pvVar13->m_data).m_type;
        (pvVar13->m_data).m_type = local_350.m_type;
        jVar18 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value = local_350.m_value;
        local_350.m_type = vVar1;
        local_350.m_value = jVar18;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_350);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_300,val_01);
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_230,"value");
        vVar1 = (pvVar13->m_data).m_type;
        (pvVar13->m_data).m_type = local_300.m_type;
        jVar18 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value = local_300.m_value;
        local_300.m_type = vVar1;
        local_300.m_value = jVar18;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_300);
        local_3e8.m_type = null;
        local_3e8._1_7_ = 0;
        local_3e8.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_3e8,
                   (double)(*(long *)((long)(val_01 + -1) + 0x10) % 1000000000) * 1e-09 +
                   (double)(*(long *)((long)(val_01 + -1) + 0x10) / 1000000000));
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_230,"time");
        vVar1 = (pvVar13->m_data).m_type;
        (pvVar13->m_data).m_type = local_3e8.m_type;
        local_3e8.m_type = vVar1;
        jVar18 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value.object = (object_t *)local_3e8.m_value;
        local_3e8.m_value = jVar18;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_3e8);
        if (0 < *(short *)((long)(val_01 + -1) + 0x1c)) {
          local_3f8.m_type = null;
          local_3f8._1_7_ = 0;
          local_3f8.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_3f8,(long)*(short *)((long)(val_01 + -1) + 0x1c));
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_230,"iteration");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_3f8.m_type;
          local_3f8.m_type = vVar1;
          jVar18 = (pvVar13->m_data).m_value;
          (pvVar13->m_data).m_value.object = (object_t *)local_3f8.m_value;
          local_3f8.m_value = jVar18;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_3f8);
        }
        if (*(char *)((long)(val_01 + -1) + 0x1e) == '\x01') {
          pIVar14 = (this->subscriptions).
                    super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          lVar17 = ((long)pIVar14 -
                    (long)(this->subscriptions).
                          super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
                   (long)*(int *)((long)(val_01 + -1) + 0x18);
          if (lVar17 == 0) {
            this_00 = pIVar14 + *(int *)((long)(val_01 + -1) + 0x18);
          }
          else {
            this_00 = (this->subscriptions).
                      super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[lVar17];
          }
          val = Input::getPublicationType_abi_cxx11_(this_00);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_360,val);
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_230,"type");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_360.m_type;
          jVar18 = (pvVar13->m_data).m_value;
          (pvVar13->m_data).m_value = local_360.m_value;
          local_360.m_type = vVar1;
          local_360.m_value = jVar18;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_360);
        }
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_438,"points");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)local_230);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_230);
        pVVar4 = (pointer)(val_01 + 1);
      } while ((pointer)(val_01 + 1) != pVVar5);
    }
  }
  if ((this->messages).
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->messages).
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_260,(initializer_list_t)ZEXT816(0),false,array);
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_438,"messages");
    vVar1 = (pvVar13->m_data).m_type;
    (pvVar13->m_data).m_type = local_260.m_type;
    jVar18 = (pvVar13->m_data).m_value;
    (pvVar13->m_data).m_value = local_260.m_value;
    local_260.m_type = vVar1;
    local_260.m_value = jVar18;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_260);
    puVar24 = (this->messages).
              super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar24 != puVar6) {
      do {
        local_298.m_type = null;
        local_298.m_value.object = (object_t *)0x0;
        TVar7.internalTimeCode =
             (((puVar24->_M_t).
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode
        ;
        local_408.m_type = null;
        local_408._1_7_ = 0;
        local_408.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_408,
                   (double)(TVar7.internalTimeCode % 1000000000) * 1e-09 +
                   (double)(TVar7.internalTimeCode / 1000000000));
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_298,"time");
        vVar1 = (pvVar13->m_data).m_type;
        (pvVar13->m_data).m_type = local_408.m_type;
        local_408.m_type = vVar1;
        jVar18 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value.object = (object_t *)local_408.m_value;
        local_408.m_value = jVar18;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_408);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &((puVar24->_M_t).
                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->source);
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_298,"src");
        vVar1 = (pvVar13->m_data).m_type;
        (pvVar13->m_data).m_type = local_370.m_type;
        jVar18 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value = local_370.m_value;
        local_370.m_type = vVar1;
        local_370.m_value = jVar18;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_370);
        pMVar8 = (puVar24->_M_t).
                 super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        __n = (pMVar8->original_source)._M_string_length;
        if ((__n != 0) &&
           ((__n != (pMVar8->source)._M_string_length ||
            (iVar12 = bcmp((pMVar8->original_source)._M_dataplus._M_p,
                           (pMVar8->source)._M_dataplus._M_p,__n), iVar12 != 0)))) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pMVar8->original_source);
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_298,"original_source");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_380.m_type;
          jVar18 = (pvVar13->m_data).m_value;
          (pvVar13->m_data).m_value = local_380.m_value;
          local_380.m_type = vVar1;
          local_380.m_value = jVar18;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_380);
        }
        pMVar8 = (puVar24->_M_t).
                 super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        uVar20 = (pMVar8->dest)._M_string_length;
        if ((uVar20 < 7) ||
           (iVar12 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&pMVar8->dest,uVar20 - 6,6,"cloneE"), iVar12 != 0)) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_390,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar24->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->dest);
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_298,"dest");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_390.m_type;
          jVar18 = (pvVar13->m_data).m_value;
          (pvVar13->m_data).m_value = local_390.m_value;
          local_390.m_type = vVar1;
          local_390.m_value = jVar18;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_390);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar24->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->original_dest
                    );
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_298,"orig_dest");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_2b0.m_type;
          local_2b0.m_type = vVar1;
          pdVar22 = &local_2b0;
        }
        else {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar24->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->original_dest
                    );
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_298,"dest");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_2c0.m_type;
          pdVar22 = &local_2c0;
          local_2c0.m_type = vVar1;
        }
        jVar18 = (pvVar13->m_data).m_value;
        (pvVar13->m_data).m_value = pdVar22->m_value;
        pdVar22->m_value = jVar18;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(pdVar22);
        bVar11 = isBinaryData(&((puVar24->_M_t).
                                super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->data
                             );
        if (bVar11) {
          bVar11 = isEscapableData(&((puVar24->_M_t).
                                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)
                                    ->data);
          if (bVar11) {
            pMVar8 = (puVar24->_M_t).
                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
            pbVar9 = (pMVar8->data).heap;
            local_230 = (undefined1  [8])(local_230 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_230,pbVar9,pbVar9 + (pMVar8->data).bufferSize);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_3a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_298,"message");
            vVar1 = (pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = local_3a0.m_type;
            jVar18 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = local_3a0.m_value;
            pdVar22 = &local_3a0;
            local_3a0.m_type = vVar1;
            local_3a0.m_value = jVar18;
            goto LAB_0029a0e6;
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<const_char_(&)[7],_char[7],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_3b0,(char (*) [7])"base64");
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_298,"encoding");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_3b0.m_type;
          jVar18 = (json_value)(pvVar13->m_data).m_value.number_unsigned;
          (pvVar13->m_data).m_value = local_3b0.m_value;
          local_3b0.m_type = vVar1;
          local_3b0.m_value = jVar18;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_3b0);
          pMVar8 = (puVar24->_M_t).
                   super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
          pbVar9 = (pMVar8->data).heap;
          local_2e0 = &local_2d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2e0,pbVar9,pbVar9 + (pMVar8->data).bufferSize);
          local_428.field_2._M_allocated_capacity._0_4_ = 0x5b343662;
          local_428._M_string_length = 4;
          local_428.field_2._M_allocated_capacity._4_4_ =
               local_428.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          gmlc::utilities::base64_encode_abi_cxx11_
                    (&local_340,(utilities *)local_2e0->_M_local_buf,(void *)(long)local_2d8,
                     jVar18.number_unsigned);
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            uVar20 = CONCAT44(local_428.field_2._M_allocated_capacity._4_4_,
                              local_428.field_2._M_allocated_capacity._0_4_);
          }
          if (uVar20 < local_340._M_string_length + local_428._M_string_length) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              uVar21 = local_340.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_340._M_string_length + local_428._M_string_length)
            goto LAB_0029a225;
            pbVar15 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_340,0,0,local_428._M_dataplus._M_p,
                                 local_428._M_string_length);
          }
          else {
LAB_0029a225:
            pbVar15 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_428,local_340._M_dataplus._M_p,local_340._M_string_length);
          }
          local_230 = (undefined1  [8])(local_230 + 0x10);
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar15->_M_dataplus)._M_p;
          paVar10 = &pbVar15->field_2;
          if (paVar19 == paVar10) {
            local_220[0]._0_8_ = paVar10->_M_allocated_capacity;
            local_220[0]._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
          }
          else {
            local_220[0]._0_8_ = paVar10->_M_allocated_capacity;
            local_230 = (undefined1  [8])paVar19;
          }
          local_228 = (json_value)pbVar15->_M_string_length;
          (pbVar15->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar15->_M_string_length = 0;
          paVar10->_M_local_buf[0] = '\0';
          pbVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_230,local_228.number_unsigned,0,1,']');
          local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar15->_M_dataplus)._M_p;
          paVar19 = &pbVar15->field_2;
          if (paVar10 == paVar19) {
            local_320.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_320.field_2._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
          }
          else {
            local_320.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_320._M_dataplus._M_p = (pointer)paVar10;
          }
          local_320._M_string_length = pbVar15->_M_string_length;
          (pbVar15->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar15->_M_string_length = 0;
          (pbVar15->field_2)._M_local_buf[0] = '\0';
          if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
            operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p,
                            CONCAT44(local_428.field_2._M_allocated_capacity._4_4_,
                                     local_428.field_2._M_allocated_capacity._0_4_) + 1);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_3c0,&local_320);
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_298,"message");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_3c0.m_type;
          jVar18 = (pvVar13->m_data).m_value;
          (pvVar13->m_data).m_value = local_3c0.m_value;
          local_3c0.m_type = vVar1;
          local_3c0.m_value = jVar18;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
          }
          uVar21 = local_2d0._M_allocated_capacity;
          auVar23 = (undefined1  [8])local_2e0;
          if (local_2e0 != &local_2d0) goto LAB_0029a461;
        }
        else {
          pMVar8 = (puVar24->_M_t).
                   super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
          pbVar9 = (pMVar8->data).heap;
          local_230 = (undefined1  [8])(local_230 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_230,pbVar9,pbVar9 + (pMVar8->data).bufferSize);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230)
          ;
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_298,"message");
          vVar1 = (pvVar13->m_data).m_type;
          (pvVar13->m_data).m_type = local_3d0.m_type;
          jVar18 = (pvVar13->m_data).m_value;
          (pvVar13->m_data).m_value = local_3d0.m_value;
          pdVar22 = &local_3d0;
          local_3d0.m_type = vVar1;
          local_3d0.m_value = jVar18;
LAB_0029a0e6:
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(pdVar22);
          uVar21 = local_220[0]._M_allocated_capacity;
          auVar23 = local_230;
          if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
LAB_0029a461:
            operator_delete((void *)auVar23,uVar21 + 1);
          }
        }
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_438,"messages");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)&local_298);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_298);
        puVar24 = puVar24 + 1;
      } while (puVar24 != puVar6);
    }
  }
  std::ofstream::ofstream(local_230,(string *)local_2a0,_S_out);
  poVar16 = nlohmann::json_abi_v3_11_3::operator<<
                      ((ostream *)local_230,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_438);
  local_428._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,(char *)&local_428,1);
  this->fileSaved = true;
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_438);
  return;
}

Assistant:

void Clone::saveFile(const std::string& filename)
{
    if (filename.empty()) {
        if (!outFileName.empty()) {
            saveFile(outFileName);
        }
        return;
    }
    nlohmann::json doc = fedConfig.empty() ? nlohmann::json() : fileops::loadJsonStr(fedConfig);
    doc["defaultglobal"] = true;
    if (!cloneSubscriptionNames.empty()) {
        doc["optional"] = true;

        doc["subscriptions"] = nlohmann::json(nlohmann::json::array());
        for (auto& sub : cloneSubscriptionNames) {
            nlohmann::json subsc;
            subsc["key"] = sub;
            doc["subscriptions"].push_back(subsc);
        }
    }
    if (!points.empty()) {
        doc["points"] = nlohmann::json(nlohmann::json::array());
        for (auto& point : points) {
            nlohmann::json pointData;
            pointData["key"] = subscriptions[point.index].getTarget();
            pointData["value"] = point.value;
            pointData["time"] = static_cast<double>(point.time);
            if (point.iteration > 0) {
                pointData["iteration"] = point.iteration;
            }
            if (point.first) {
                pointData["type"] = subscriptions[point.index].getPublicationType();
            }
            doc["points"].push_back(pointData);
        }
    }

    if (!messages.empty()) {
        doc["messages"] = nlohmann::json(nlohmann::json::array());
        for (auto& mess : messages) {
            nlohmann::json message;
            message["time"] = static_cast<double>(mess->time);
            message["src"] = mess->source;
            if ((!mess->original_source.empty()) && (mess->original_source != mess->source)) {
                message["original_source"] = mess->original_source;
            }
            if ((mess->dest.size() < 7) ||
                (mess->dest.compare(mess->dest.size() - 6, 6, "cloneE") != 0)) {
                message["dest"] = mess->dest;
                message["orig_dest"] = mess->original_dest;
            } else {
                message["dest"] = mess->original_dest;
            }
            if (isBinaryData(mess->data)) {
                if (isEscapableData(mess->data)) {
                    message["message"] = std::string(mess->data.to_string());
                } else {
                    message["encoding"] = "base64";
                    message["message"] = encode(std::string(mess->data.to_string()));
                }

            } else {
                message["message"] = std::string(mess->data.to_string());
            }
            doc["messages"].push_back(message);
        }
    }

    std::ofstream outfile(filename);
    outfile << doc << '\n';
    fileSaved = true;
}